

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::
ParseVisibilityTest_Edition2024NonStrictExportMessage_Test::
~ParseVisibilityTest_Edition2024NonStrictExportMessage_Test
          (ParseVisibilityTest_Edition2024NonStrictExportMessage_Test *this)

{
  ParserTest::~ParserTest(&this->super_ParseVisibilityTest);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseVisibilityTest, Edition2024NonStrictExportMessage) {
  ExpectParsesTo(
      R"schema(
        edition = "2024";
        export message A {
          local enum NestedEnum {
            A_VAL = 0;
          }
          export message NestedMessage {
          }
        })schema",
      R"pb(message_type {
             name: "A"
             enum_type {
               name: "NestedEnum"
               value { name: "A_VAL" number: 0 }
               visibility: VISIBILITY_LOCAL
             }
             nested_type { name: "NestedMessage" visibility: VISIBILITY_EXPORT }
             visibility: VISIBILITY_EXPORT
           }
           syntax: "editions"
           edition: EDITION_2024
      )pb");
}